

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

lostFraction __thiscall llvm::detail::IEEEFloat::divideSignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  uint uVar1;
  WordType *parts;
  bool bVar2;
  uint uVar3;
  int iVar4;
  integerPart *parts_00;
  ulong uVar5;
  uint uVar6;
  lostFraction lVar7;
  Significand *pSVar8;
  uint n;
  Significand *parts_01;
  integerPart scratch [4];
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x439,
                  "lostFraction llvm::detail::IEEEFloat::divideSignificand(const IEEEFloat &)");
  }
  uVar6 = this->semantics->precision;
  if (uVar6 - 0x40 < 0xffffff80) {
    parts_01 = (Significand *)(this->significand).parts;
  }
  else {
    parts_01 = &this->significand;
  }
  if (rhs->semantics->precision - 0x40 < 0xffffff80) {
    pSVar8 = (Significand *)(rhs->significand).parts;
  }
  else {
    pSVar8 = &rhs->significand;
  }
  uVar1 = uVar6 + 0x40;
  n = uVar1 >> 6;
  if (uVar1 < 0xc0) {
    parts_00 = scratch;
  }
  else {
    parts_00 = (integerPart *)operator_new__((ulong)(n << 4));
  }
  parts = (WordType *)((long)parts_00 + (ulong)(n * 8));
  for (uVar5 = 0; n * 8 != uVar5; uVar5 = uVar5 + 8) {
    *(undefined8 *)((long)parts_00 + uVar5) = *(undefined8 *)((long)parts_01 + uVar5);
    *(undefined8 *)((long)parts + uVar5) = *(undefined8 *)((long)pSVar8 + uVar5);
    *(undefined8 *)((long)parts_01 + uVar5) = 0;
  }
  this->exponent = this->exponent - rhs->exponent;
  uVar3 = APInt::tcMSB(parts,n);
  uVar3 = ~uVar3 + uVar6;
  if (uVar3 != 0) {
    this->exponent = this->exponent + (short)uVar3;
    APInt::tcShiftLeft(parts,n,uVar3);
  }
  uVar3 = APInt::tcMSB(parts_00,n);
  uVar3 = ~uVar3 + uVar6;
  if (uVar3 != 0) {
    this->exponent = this->exponent - (short)uVar3;
    APInt::tcShiftLeft(parts_00,n,uVar3);
  }
  iVar4 = APInt::tcCompare(parts_00,parts,n);
  if (iVar4 < 0) {
    this->exponent = this->exponent + -1;
    APInt::tcShiftLeft(parts_00,n,1);
    iVar4 = APInt::tcCompare(parts_00,parts,n);
    if (iVar4 < 0) {
      __assert_fail("APInt::tcCompare(dividend, divisor, partsCount) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x465,
                    "lostFraction llvm::detail::IEEEFloat::divideSignificand(const IEEEFloat &)");
    }
  }
  for (; iVar4 = APInt::tcCompare(parts_00,parts,n), uVar6 != 0; uVar6 = uVar6 - 1) {
    if (-1 < iVar4) {
      APInt::tcSubtract(parts_00,parts,0,n);
      APInt::tcSetBit(&parts_01->part,uVar6 - 1);
    }
    APInt::tcShiftLeft(parts_00,n,1);
  }
  if (iVar4 < 1) {
    if (iVar4 == 0) {
      lVar7 = lfExactlyHalf;
    }
    else {
      bVar2 = APInt::tcIsZero(parts_00,n);
      lVar7 = (lostFraction)!bVar2;
    }
  }
  else {
    lVar7 = lfMoreThanHalf;
  }
  if (0xbf < uVar1) {
    operator_delete__(parts_00);
  }
  return lVar7;
}

Assistant:

lostFraction IEEEFloat::divideSignificand(const IEEEFloat &rhs) {
  unsigned int bit, i, partsCount;
  const integerPart *rhsSignificand;
  integerPart *lhsSignificand, *dividend, *divisor;
  integerPart scratch[4];
  lostFraction lost_fraction;

  assert(semantics == rhs.semantics);

  lhsSignificand = significandParts();
  rhsSignificand = rhs.significandParts();
  partsCount = partCount();

  if (partsCount > 2)
    dividend = new integerPart[partsCount * 2];
  else
    dividend = scratch;

  divisor = dividend + partsCount;

  /* Copy the dividend and divisor as they will be modified in-place.  */
  for (i = 0; i < partsCount; i++) {
    dividend[i] = lhsSignificand[i];
    divisor[i] = rhsSignificand[i];
    lhsSignificand[i] = 0;
  }

  exponent -= rhs.exponent;

  unsigned int precision = semantics->precision;

  /* Normalize the divisor.  */
  bit = precision - APInt::tcMSB(divisor, partsCount) - 1;
  if (bit) {
    exponent += bit;
    APInt::tcShiftLeft(divisor, partsCount, bit);
  }

  /* Normalize the dividend.  */
  bit = precision - APInt::tcMSB(dividend, partsCount) - 1;
  if (bit) {
    exponent -= bit;
    APInt::tcShiftLeft(dividend, partsCount, bit);
  }

  /* Ensure the dividend >= divisor initially for the loop below.
     Incidentally, this means that the division loop below is
     guaranteed to set the integer bit to one.  */
  if (APInt::tcCompare(dividend, divisor, partsCount) < 0) {
    exponent--;
    APInt::tcShiftLeft(dividend, partsCount, 1);
    assert(APInt::tcCompare(dividend, divisor, partsCount) >= 0);
  }

  /* Long division.  */
  for (bit = precision; bit; bit -= 1) {
    if (APInt::tcCompare(dividend, divisor, partsCount) >= 0) {
      APInt::tcSubtract(dividend, divisor, 0, partsCount);
      APInt::tcSetBit(lhsSignificand, bit - 1);
    }

    APInt::tcShiftLeft(dividend, partsCount, 1);
  }

  /* Figure out the lost fraction.  */
  int cmp = APInt::tcCompare(dividend, divisor, partsCount);

  if (cmp > 0)
    lost_fraction = lfMoreThanHalf;
  else if (cmp == 0)
    lost_fraction = lfExactlyHalf;
  else if (APInt::tcIsZero(dividend, partsCount))
    lost_fraction = lfExactlyZero;
  else
    lost_fraction = lfLessThanHalf;

  if (partsCount > 2)
    delete [] dividend;

  return lost_fraction;
}